

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageDocumentHelper::addPageAt
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *newpage,bool before,
          QPDFPageObjectHelper *refpage)

{
  QPDF *this_00;
  byte bVar1;
  undefined1 local_48 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  QPDFPageObjectHelper *refpage_local;
  QPDFPageObjectHelper *pQStack_18;
  bool before_local;
  QPDFPageObjectHelper *newpage_local;
  QPDFPageDocumentHelper *this_local;
  
  this_00 = (this->super_QPDFDocumentHelper).qpdf;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)refpage;
  refpage_local._7_1_ = before;
  pQStack_18 = newpage;
  newpage_local = (QPDFPageObjectHelper *)this;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)(local_48 + 0x10));
  bVar1 = refpage_local._7_1_;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_48);
  QPDF::addPageAt(this_00,(QPDFObjectHandle *)(local_48 + 0x10),(bool)(bVar1 & 1),
                  (QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_48 + 0x10));
  return;
}

Assistant:

void
QPDFPageDocumentHelper::addPageAt(
    QPDFPageObjectHelper newpage, bool before, QPDFPageObjectHelper refpage)
{
    this->qpdf.addPageAt(newpage.getObjectHandle(), before, refpage.getObjectHandle());
}